

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall slang::parsing::Lexer::lexEscapeSequence(Lexer *this,bool isMacroName)

{
  bool bVar1;
  char cVar2;
  byte in_SIL;
  Lexer *in_RDI;
  char c;
  TokenKind in_stack_0000004e;
  Lexer *in_stack_00000050;
  TokenKind in_stack_0000005e;
  Lexer *in_stack_00000060;
  char local_1a;
  Token local_10;
  
  local_1a = peek(in_RDI);
  bVar1 = isWhitespace(local_1a);
  if ((bVar1) || (local_1a == '\0')) {
    bVar1 = isNewline(local_1a);
    if (bVar1) {
      advance(in_RDI);
      if ((local_1a == '\r') && (cVar2 = peek(in_RDI), cVar2 == '\n')) {
        advance(in_RDI);
      }
      local_10 = create<>(in_stack_00000050,in_stack_0000004e);
    }
    else {
      local_10 = create<>(in_stack_00000050,in_stack_0000004e);
    }
  }
  else {
    do {
      bVar1 = isPrintableASCII(local_1a);
      if (!bVar1) break;
      advance(in_RDI);
      local_1a = peek(in_RDI);
      bVar1 = isWhitespace(local_1a);
    } while (!bVar1);
    if ((in_SIL & 1) == 0) {
      local_10 = create<>(in_stack_00000050,in_stack_0000004e);
    }
    else {
      local_10 = create<slang::syntax::SyntaxKind>
                           (in_stack_00000060,in_stack_0000005e,(SyntaxKind *)in_stack_00000050);
    }
  }
  return local_10;
}

Assistant:

Token Lexer::lexEscapeSequence(bool isMacroName) {
    char c = peek();
    if (isWhitespace(c) || c == '\0') {
        // Check for a line continuation sequence.
        if (isNewline(c)) {
            advance();
            if (c == '\r' && peek() == '\n')
                advance();
            return create(TokenKind::LineContinuation);
        }

        // Error issued in the Preprocessor
        return create(TokenKind::Unknown);
    }

    while (isPrintableASCII(c)) {
        advance();
        c = peek();
        if (isWhitespace(c))
            break;
    }

    if (isMacroName)
        return create(TokenKind::Directive, SyntaxKind::MacroUsage);

    return create(TokenKind::Identifier);
}